

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

WebPMuxError MuxGetCanvasInfo(WebPMux *mux,int *width,int *height,uint32_t *flags)

{
  WebPMuxError WVar1;
  int iVar2;
  int iVar3;
  WebPMux *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  WebPMuxImage *wpi;
  WebPData data;
  uint32_t f;
  int h;
  int w;
  WebPMux *in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  long lVar4;
  ulong local_40;
  uint in_stack_ffffffffffffffc8;
  uint32_t uVar5;
  uint32_t in_stack_ffffffffffffffd0;
  CHUNK_INDEX in_stack_ffffffffffffffd4;
  WebPMuxError local_4;
  
  uVar5 = 0;
  WVar1 = MuxGet(in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                 (WebPData *)(ulong)in_stack_ffffffffffffffc8);
  if (WVar1 == WEBP_MUX_OK) {
    if (local_40 < 10) {
      return WEBP_MUX_BAD_DATA;
    }
    uVar5 = GetLE32(in_stack_ffffffffffffffb0);
    iVar2 = GetLE24((uint8_t *)0x1a6fdc);
    iVar2 = iVar2 + 1;
    iVar3 = GetLE24((uint8_t *)0x1a6ff1);
    iVar3 = iVar3 + 1;
  }
  else {
    lVar4 = *in_RDI;
    iVar2 = (int)in_RDI[7];
    iVar3 = *(int *)((long)in_RDI + 0x3c);
    if (((iVar2 == 0) && (iVar3 == 0)) &&
       (WVar1 = ValidateForSingleImage(in_stack_ffffffffffffffa8), WVar1 == WEBP_MUX_OK)) {
      iVar2 = *(int *)(lVar4 + 0x20);
      iVar3 = *(int *)(lVar4 + 0x24);
    }
    if ((lVar4 != 0) && (*(int *)(lVar4 + 0x28) != 0)) {
      uVar5 = uVar5 | 0x10;
    }
  }
  if ((ulong)((long)iVar2 * (long)iVar3) < 0x100000000) {
    if (in_RSI != (int *)0x0) {
      *in_RSI = iVar2;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = iVar3;
    }
    if (in_RCX != (WebPMux *)0x0) {
      *(uint32_t *)&in_RCX->images_ = uVar5;
    }
    local_4 = WEBP_MUX_OK;
  }
  else {
    local_4 = WEBP_MUX_BAD_DATA;
  }
  return local_4;
}

Assistant:

static WebPMuxError MuxGetCanvasInfo(const WebPMux* const mux,
                                     int* width, int* height, uint32_t* flags) {
  int w, h;
  uint32_t f = 0;
  WebPData data;
  assert(mux != NULL);

  // Check if VP8X chunk is present.
  if (MuxGet(mux, IDX_VP8X, 1, &data) == WEBP_MUX_OK) {
    if (data.size < VP8X_CHUNK_SIZE) return WEBP_MUX_BAD_DATA;
    f = GetLE32(data.bytes + 0);
    w = GetLE24(data.bytes + 4) + 1;
    h = GetLE24(data.bytes + 7) + 1;
  } else {
    const WebPMuxImage* const wpi = mux->images_;
    // Grab user-forced canvas size as default.
    w = mux->canvas_width_;
    h = mux->canvas_height_;
    if (w == 0 && h == 0 && ValidateForSingleImage(mux) == WEBP_MUX_OK) {
      // single image and not forced canvas size => use dimension of first frame
      assert(wpi != NULL);
      w = wpi->width_;
      h = wpi->height_;
    }
    if (wpi != NULL) {
      if (wpi->has_alpha_) f |= ALPHA_FLAG;
    }
  }
  if (w * (uint64_t)h >= MAX_IMAGE_AREA) return WEBP_MUX_BAD_DATA;

  if (width != NULL) *width = w;
  if (height != NULL) *height = h;
  if (flags != NULL) *flags = f;
  return WEBP_MUX_OK;
}